

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O0

void __thiscall Gillespie::Iterate(Gillespie *this)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  underflow_error *this_01;
  __shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  SpeciesTracker *pSVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  char *__filename;
  double extraout_XMM0_Qa;
  double dVar9;
  shared_ptr<Reaction> local_60;
  shared_ptr<Reaction> local_50;
  double local_40;
  double alpha_diff;
  int i;
  int next_reaction;
  double tau;
  double random_num;
  Gillespie *local_10;
  Gillespie *this_local;
  
  local_10 = this;
  if ((this->initialized_ & 1U) == 0) {
    Initialize(this);
  }
  if (this->alpha_sum_ <= 0.0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Gillespie: Propensity of system is 0. No reactions will execute.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Random::random();
  dVar9 = this->alpha_sum_;
  _i = log(1.0 / extraout_XMM0_Qa);
  _i = (1.0 / dVar9) * _i;
  bVar1 = std::isnormal(_i);
  if (!bVar1) {
    this_01 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::underflow_error::underflow_error(this_01,"Underflow error.");
    __cxa_throw(this_01,&std::underflow_error::typeinfo,std::underflow_error::~underflow_error);
  }
  this->time_ = _i + this->time_;
  alpha_diff._4_4_ =
       Random::WeightedChoiceIndex<std::shared_ptr<Reaction>>(&this->reactions_,&this->alpha_list_);
  p_Var3 = (__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
           operator[](&this->reactions_,(long)alpha_diff._4_4_);
  peVar4 = std::__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  (*peVar4->_vptr_Reaction[1])();
  p_Var3 = (__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
           operator[](&this->reactions_,(long)alpha_diff._4_4_);
  peVar4 = std::__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  bVar1 = Reaction::is_tRNA(peVar4);
  if (!bVar1) {
    pSVar5 = SpeciesTracker::Instance();
    bVar1 = SpeciesTracker::check_force_update(pSVar5);
    if (!bVar1) {
      pvVar8 = std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
               operator[](&this->reactions_,(long)alpha_diff._4_4_);
      std::shared_ptr<Reaction>::shared_ptr(&local_60,pvVar8);
      UpdatePropensity(this,&local_60);
      std::shared_ptr<Reaction>::~shared_ptr(&local_60);
      goto LAB_0015a069;
    }
  }
  alpha_diff._0_4_ = 0;
  while( true ) {
    uVar6 = (ulong)alpha_diff._0_4_;
    sVar7 = std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
            size(&this->reactions_);
    if (sVar7 <= uVar6) break;
    pvVar8 = std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
             operator[](&this->reactions_,(long)alpha_diff._0_4_);
    std::shared_ptr<Reaction>::shared_ptr(&local_50,pvVar8);
    dVar9 = IndexUpdatePropensity(this,&local_50,alpha_diff._0_4_);
    std::shared_ptr<Reaction>::~shared_ptr(&local_50);
    this->alpha_sum_ = dVar9 + this->alpha_sum_;
    alpha_diff._0_4_ = alpha_diff._0_4_ + 1;
    local_40 = dVar9;
  }
  pSVar5 = SpeciesTracker::Instance();
  SpeciesTracker::unflag_force_update(pSVar5);
LAB_0015a069:
  __filename = (char *)(long)alpha_diff._4_4_;
  p_Var3 = (__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
           operator[](&this->reactions_,(size_type)__filename);
  peVar4 = std::__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  iVar2 = Reaction::remove(peVar4,__filename);
  if (((byte)iVar2 & 1) == 1) {
    DeleteReaction(this,alpha_diff._4_4_);
  }
  this->iteration_ = this->iteration_ + 1;
  return;
}

Assistant:

void Gillespie::Iterate() {
  // Make sure propensities have been initialized
  // std::cout << "begin iteration" << std::endl;
  if (initialized_ == false) {
    Initialize();
  }

  // Basic sanity checks
  if (alpha_sum_ <= 0) {
    throw std::runtime_error(
        "Gillespie: Propensity of system is 0. No reactions will execute.");
  }
  double random_num = Random::random();
  // Calculate tau, i.e. time until next reaction
  double tau = (1.0 / alpha_sum_) * std::log(1.0 / random_num);
  if (!std::isnormal(tau)) {
    throw std::underflow_error("Underflow error.");
  }
  time_ += tau;
  // Randomly select next reaction to execute, weighted by propensities
  auto next_reaction = Random::WeightedChoiceIndex(reactions_, alpha_list_);
  reactions_[next_reaction]->Execute();
  // std::cout << std::to_string(alpha_list_[next_reaction]) << std::endl;
  // if (!SpeciesTracker::Instance().codon_map().empty()) {
  if (reactions_[next_reaction]->is_tRNA() || SpeciesTracker::Instance().check_force_update()) {
    for (int i = 0; i < reactions_.size(); i++) {
      double alpha_diff = IndexUpdatePropensity(reactions_[i], i);
      alpha_sum_ += alpha_diff;
    }
    SpeciesTracker::Instance().unflag_force_update();
  } else {
    UpdatePropensity(reactions_[next_reaction]);
  }
  if (reactions_[next_reaction]->remove() == true) {
    // std::cout << std::to_string(alpha_list_[next_reaction]) << std::endl;
    DeleteReaction(next_reaction);
  }
  iteration_++;
}